

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/catch.hpp:9701:33)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kainjow[P]Mustache_tests_catch_hpp:9701:33)>
          *this,string *arg)

{
  What *pWVar1;
  int iVar2;
  What WVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_b8);
  local_50 = 0;
  local_58 = &PTR__BasicResult_00241a40;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  iVar2 = ::std::__cxx11::string::compare((char *)&local_b8);
  if (iVar2 == 0) {
    WVar3 = NoAssertions;
  }
  else {
    iVar2 = ::std::__cxx11::string::compare((char *)&local_b8);
    if (iVar2 != 0) {
      ::std::operator+(&local_78,"Unrecognised warning: \'",&local_b8);
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_78);
      psVar5 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_98.field_2._M_allocated_capacity = *psVar5;
        local_98.field_2._8_8_ = plVar4[3];
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar5;
        local_98._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_98._M_string_length = plVar4[1];
      *plVar4 = (long)psVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                (__return_storage_ptr__,RuntimeError,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001cab8a;
    }
    WVar3 = NoTests;
  }
  pWVar1 = &((this->m_lambda).config)->warnings;
  *pWVar1 = *pWVar1 | WVar3;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00241a40;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_001cab8a:
  local_58 = &PTR__BasicResult_00241a40;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }